

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 *cr_min,ImVec2 *cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImVec4 *pIVar4;
  ImVec4 *__dest;
  int iVar5;
  undefined7 in_register_00000009;
  int iVar6;
  float fVar7;
  float fVar9;
  ulong uVar8;
  float fVar10;
  float fVar11;
  
  fVar7 = (*cr_min).x;
  fVar9 = (*cr_min).y;
  fVar10 = (*cr_max).x;
  fVar11 = (*cr_max).y;
  if ((int)CONCAT71(in_register_00000009,intersect_with_current_clip_rect) != 0) {
    fVar1 = (this->_CmdHeader).ClipRect.x;
    fVar2 = (this->_CmdHeader).ClipRect.y;
    if (fVar7 < fVar1) {
      fVar7 = fVar1;
    }
    fVar1 = (this->_CmdHeader).ClipRect.z;
    if (fVar9 < fVar2) {
      fVar9 = fVar2;
    }
    fVar2 = (this->_CmdHeader).ClipRect.w;
    if (fVar1 < fVar10) {
      fVar10 = fVar1;
    }
    if (fVar2 < fVar11) {
      fVar11 = fVar2;
    }
  }
  iVar6 = (this->_ClipRectStack).Size;
  iVar3 = (this->_ClipRectStack).Capacity;
  if (iVar6 == iVar3) {
    iVar6 = iVar6 + 1;
    if (iVar3 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar3 / 2 + iVar3;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar3 < iVar6) {
      __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar6 << 4);
      pIVar4 = (this->_ClipRectStack).Data;
      if (pIVar4 != (ImVec4 *)0x0) {
        memcpy(__dest,pIVar4,(long)(this->_ClipRectStack).Size << 4);
        ImGui::MemFree((this->_ClipRectStack).Data);
      }
      (this->_ClipRectStack).Data = __dest;
      (this->_ClipRectStack).Capacity = iVar6;
    }
  }
  uVar8 = CONCAT44(~-(uint)(fVar11 <= fVar9) & (uint)fVar11,~-(uint)(fVar10 <= fVar7) & (uint)fVar10
                  ) |
          CONCAT44((uint)fVar9 & -(uint)(fVar11 <= fVar9),(uint)fVar7 & -(uint)(fVar10 <= fVar7));
  fVar10 = (float)uVar8;
  fVar11 = (float)(uVar8 >> 0x20);
  pIVar4 = (this->_ClipRectStack).Data + (this->_ClipRectStack).Size;
  pIVar4->x = fVar7;
  pIVar4->y = fVar9;
  pIVar4->z = fVar10;
  pIVar4->w = fVar11;
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  (this->_CmdHeader).ClipRect.x = fVar7;
  (this->_CmdHeader).ClipRect.y = fVar9;
  (this->_CmdHeader).ClipRect.z = fVar10;
  (this->_CmdHeader).ClipRect.w = fVar11;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(const ImVec2& cr_min, const ImVec2& cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}